

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<unsigned_char_const>::operator==
          (ArrayPtr<unsigned_char_const> *this,ArrayPtr<unsigned_char> *other)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t sVar3;
  bool bVar4;
  
  if (*(size_t *)(this + 8) != other->size_) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar4 = *(size_t *)(this + 8) == sVar3;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = (uchar *)(*(long *)this + sVar3);
    puVar2 = other->ptr + sVar3;
    sVar3 = sVar3 + 1;
  } while (*puVar1 == *puVar2);
  return bVar4;
}

Assistant:

inline bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }